

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O2

int __thiscall NetOptimize::fuse_deconvolutiondepthwise_batchnorm(NetOptimize *this)

{
  float fVar1;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar2;
  Layer *pLVar3;
  pointer ppLVar4;
  long *plVar5;
  Layer *pLVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  int *piVar10;
  long lVar11;
  pointer piVar12;
  long lVar13;
  ulong uVar14;
  int j;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  float fVar20;
  ulong local_c0;
  Mat local_b8;
  Layer *local_68;
  vector<float,_std::allocator<float>_> b;
  vector<float,_std::allocator<float>_> a;
  
  pvVar2 = (this->super_ModelWriter).layers;
  uVar16 = (long)(pvVar2->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(pvVar2->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_start >> 3;
  local_c0 = 1;
  uVar19 = 0;
  do {
    if (uVar19 == uVar16) {
      return 0;
    }
    bVar7 = std::operator!=(&(((this->super_ModelWriter).layers)->
                             super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                             _M_impl.super__Vector_impl_data._M_start[uVar19]->type,
                            "DeconvolutionDepthWise");
    if (!bVar7) {
      iVar9 = *((((this->super_ModelWriter).layers)->
                super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar19]->tops).
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      for (uVar17 = local_c0; uVar17 < uVar16; uVar17 = uVar17 + 1) {
        bVar7 = std::operator!=(&(((this->super_ModelWriter).layers)->
                                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                                 _M_impl.super__Vector_impl_data._M_start[uVar17]->type,"BatchNorm")
        ;
        if (((!bVar7) &&
            (pLVar3 = (((this->super_ModelWriter).layers)->
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                      super__Vector_impl_data._M_start[uVar17],
            piVar10 = (pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
            (long)(pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)piVar10 == 4)) && (*piVar10 == iVar9)) {
          if (uVar16 != uVar17) {
            ppLVar4 = (((this->super_ModelWriter).layers)->
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            local_68 = ppLVar4[uVar19];
            pLVar3 = ppLVar4[uVar17];
            fprintf(_stderr,"fuse_deconvolutiondepthwise_batchnorm %s %s\n",
                    (local_68->name)._M_dataplus._M_p);
            uVar8 = *(uint *)&pLVar3[1]._vptr_Layer;
            fVar1 = *(float *)((long)&pLVar3[1]._vptr_Layer + 4);
            std::vector<float,_std::allocator<float>_>::vector
                      (&a,(long)(int)uVar8,(allocator_type *)&local_b8);
            std::vector<float,_std::allocator<float>_>::vector
                      (&b,(long)(int)uVar8,(allocator_type *)&local_b8);
            uVar17 = 0;
            if (0 < (int)uVar8) {
              uVar17 = (ulong)uVar8;
            }
            for (uVar18 = 0; pLVar6 = local_68, uVar17 != uVar18; uVar18 = uVar18 + 1) {
              fVar20 = (float)pLVar3[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage[uVar18] + fVar1;
              if (fVar20 < 0.0) {
                fVar20 = sqrtf(fVar20);
              }
              else {
                fVar20 = SQRT(fVar20);
              }
              lVar11 = *(long *)&pLVar3[1].one_blob_only;
              a.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar18] =
                   *(float *)(*(long *)&pLVar3[2].support_tensor_storage + uVar18 * 4) -
                   (*(float *)(lVar11 + uVar18 * 4) *
                   *(float *)(pLVar3[1].name._M_dataplus._M_p + uVar18 * 4)) / fVar20;
              b.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar18] = *(float *)(lVar11 + uVar18 * 4) / fVar20;
            }
            if (*(int *)((long)&local_68[1].type._M_string_length + 4) == 0) {
              *(undefined4 *)((long)&local_68[1].type._M_string_length + 4) = 1;
              local_b8.cstep = 0;
              local_b8.data = (void *)0x0;
              local_b8.refcount._0_4_ = 0;
              local_b8.refcount._4_4_ = 0;
              local_b8.elemsize._0_4_ = 0;
              local_b8.elemsize._4_4_ = 0;
              local_b8.elempack = 0;
              local_b8.h = 0;
              local_b8.d = 0;
              local_b8.c = 0;
              local_b8.allocator = (Allocator *)0x0;
              local_b8.dims = 0;
              local_b8.w = 0;
              ncnn::Mat::create(&local_b8,uVar8,4,(Allocator *)0x0);
              piVar10 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
              if ((Mat *)&pLVar6[2].support_tensor_storage != &local_b8) {
                if (piVar10 != (int *)0x0) {
                  LOCK();
                  *piVar10 = *piVar10 + 1;
                  UNLOCK();
                }
                piVar10 = *(int **)&pLVar6[2].support_reserved_6;
                if (piVar10 != (int *)0x0) {
                  LOCK();
                  *piVar10 = *piVar10 + -1;
                  UNLOCK();
                  if (*piVar10 == 0) {
                    plVar5 = (long *)pLVar6[2].type._M_dataplus._M_p;
                    if (plVar5 == (long *)0x0) {
                      free(*(void **)&pLVar6[2].support_tensor_storage);
                    }
                    else {
                      (**(code **)(*plVar5 + 0x18))();
                    }
                  }
                }
                *(void **)&pLVar6[2].support_tensor_storage = local_b8.data;
                piVar10 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
                *(int **)&pLVar6[2].support_reserved_6 = piVar10;
                pLVar6[2].userdata =
                     (void *)CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize);
                pLVar6[2].typeindex = local_b8.elempack;
                pLVar6[2].type._M_dataplus._M_p = (pointer)local_b8.allocator;
                *(int *)&pLVar6[2].type._M_string_length = local_b8.dims;
                *(int *)((long)&pLVar6[2].type._M_string_length + 4) = local_b8.w;
                *(int *)&pLVar6[2].type.field_2 = local_b8.h;
                *(int *)((long)&pLVar6[2].type.field_2 + 4) = local_b8.d;
                *(int *)((long)&pLVar6[2].type.field_2 + 8) = local_b8.c;
                pLVar6[2].name._M_dataplus._M_p = (pointer)local_b8.cstep;
              }
              if (piVar10 != (int *)0x0) {
                LOCK();
                *piVar10 = *piVar10 + -1;
                UNLOCK();
                if (*piVar10 == 0) {
                  if (local_b8.allocator == (Allocator *)0x0) {
                    free(local_b8.data);
                  }
                  else {
                    (*(local_b8.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              iVar9 = *(int *)((long)&pLVar6[2].type.field_2 + 8) *
                      *(int *)&pLVar6[2].name._M_dataplus._M_p;
              lVar11 = *(long *)&pLVar6[2].support_tensor_storage;
              if (iVar9 < 1) {
                iVar9 = 0;
              }
              for (lVar13 = 0; iVar9 != (int)lVar13; lVar13 = lVar13 + 1) {
                *(undefined4 *)(lVar11 + lVar13 * 4) = 0;
              }
            }
            else {
              lVar11._0_1_ = local_68[2].support_tensor_storage;
              lVar11._1_1_ = local_68[2].support_reserved_00;
              lVar11._2_1_ = local_68[2].support_reserved_0;
              lVar11._3_1_ = local_68[2].support_reserved_1;
              lVar11._4_1_ = local_68[2].support_reserved_2;
              lVar11._5_1_ = local_68[2].support_reserved_3;
              lVar11._6_1_ = local_68[2].support_reserved_4;
              lVar11._7_1_ = local_68[2].support_reserved_5;
            }
            uVar8 = *(int *)&pLVar6[1].type.field_2 / (int)uVar8;
            piVar12 = pLVar6[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
            uVar18 = 0;
            if (0 < (int)uVar8) {
              uVar18 = (ulong)uVar8;
            }
            for (uVar14 = 0; uVar14 != uVar17; uVar14 = uVar14 + 1) {
              for (uVar15 = 0; uVar18 != uVar15; uVar15 = uVar15 + 1) {
                piVar12[uVar15] =
                     (int)(b.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar14] * (float)piVar12[uVar15]);
              }
              *(float *)(lVar11 + uVar14 * 4) =
                   *(float *)(lVar11 + uVar14 * 4) *
                   b.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar14] +
                   a.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar14];
              piVar12 = piVar12 + (int)uVar8;
            }
            std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                      (&b.super__Vector_base<float,_std::allocator<float>_>);
            std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                      (&a.super__Vector_base<float,_std::allocator<float>_>);
            iVar9 = *(pLVar3->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            *(pLVar6->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start = iVar9;
            (((this->super_ModelWriter).blobs)->
            super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
            super__Vector_impl_data._M_start[iVar9].producer = (int)uVar19;
            std::__cxx11::string::assign((char *)&pLVar3->type);
          }
          break;
        }
      }
    }
    uVar19 = uVar19 + 1;
    local_c0 = local_c0 + 1;
  } while( true );
}

Assistant:

int NetOptimize::fuse_deconvolutiondepthwise_batchnorm()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "DeconvolutionDepthWise")
            continue;

        // DeconvolutionDepthWise - BatchNorm
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "BatchNorm")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        // fuse DeconvolutionDepthWise - BatchNorm to DeconvolutionDepthWise
        ncnn::DeconvolutionDepthWise* deconvolutiondepthwise = (ncnn::DeconvolutionDepthWise*)layers[i];
        ncnn::BatchNorm* batchnorm = (ncnn::BatchNorm*)layers[j];

        fprintf(stderr, "fuse_deconvolutiondepthwise_batchnorm %s %s\n", deconvolutiondepthwise->name.c_str(), batchnorm->name.c_str());

        {
            int channels = batchnorm->channels;
            float eps = batchnorm->eps;

            // a = bias - slope * mean / sqrt(var + eps)
            // b = slope / sqrt(var + eps)
            // value = value * b + a

            std::vector<float> a(channels);
            std::vector<float> b(channels);
            for (int i = 0; i < channels; i++)
            {
                float sqrt_var = static_cast<float>(sqrt(batchnorm->var_data[i] + eps));
                a[i] = batchnorm->bias_data[i] - batchnorm->slope_data[i] * batchnorm->mean_data[i] / sqrt_var;
                b[i] = batchnorm->slope_data[i] / sqrt_var;
            }

            if (deconvolutiondepthwise->bias_term == 0)
            {
                // init bias as zero
                deconvolutiondepthwise->bias_term = 1;
                deconvolutiondepthwise->bias_data = ncnn::Mat(channels);
                deconvolutiondepthwise->bias_data.fill(0.f);
            }

            const int weight_per_outch = deconvolutiondepthwise->weight_data_size / channels;

            float* weight = deconvolutiondepthwise->weight_data;
            float* bias = deconvolutiondepthwise->bias_data;
            for (int i = 0; i < channels; i++)
            {
                float* conv_weight_outch = weight + weight_per_outch * i;
                for (int j = 0; j < weight_per_outch; j++)
                {
                    conv_weight_outch[j] *= b[i];
                }

                bias[i] = bias[i] * b[i] + a[i];
            }
        }

        int top_blob_index_final = batchnorm->tops[0];
        deconvolutiondepthwise->tops[0] = top_blob_index_final;
        blobs[top_blob_index_final].producer = i;
        batchnorm->type = "ncnnfused";
    }

    return 0;
}